

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

double __thiscall Minisat::Solver::progressEstimate(Solver *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  Size *pSVar5;
  int iVar6;
  int i;
  ulong uVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  iVar1 = this->next_var;
  dVar9 = 0.0;
  lVar8 = 0;
  for (uVar7 = 0; uVar2 = (this->trail_lim).sz, (long)uVar7 <= (long)(int)uVar2; uVar7 = uVar7 + 1)
  {
    piVar4 = (this->trail_lim).data;
    if (lVar8 == 0) {
      iVar6 = 0;
    }
    else {
      iVar6 = *(int *)((long)piVar4 + lVar8 + -4);
    }
    pSVar5 = (Size *)((long)piVar4 + lVar8);
    if (uVar7 == uVar2) {
      pSVar5 = &(this->trail).sz;
    }
    iVar3 = *pSVar5;
    dVar10 = pow(1.0 / (double)iVar1,(double)(int)uVar7);
    dVar9 = dVar9 + (double)(iVar3 - iVar6) * dVar10;
    lVar8 = lVar8 + 4;
  }
  return dVar9 / (double)this->next_var;
}

Assistant:

double Solver::progressEstimate() const
{
    double  progress = 0;
    double  F = 1.0 / nVars();

    for (int i = 0; i <= decisionLevel(); i++){
        int beg = i == 0 ? 0 : trail_lim[i - 1];
        int end = i == decisionLevel() ? trail.size() : trail_lim[i];
        progress += pow(F, i) * (end - beg);
    }

    return progress / nVars();
}